

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall
HEkkPrimal::hyperChooseColumnChangedInfeasibility
          (HEkkPrimal *this,double infeasibility,HighsInt iCol)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  ulong uVar4;
  double dVar5;
  
  dVar5 = infeasibility * infeasibility;
  pdVar3 = (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar3[iCol];
  dVar2 = this->max_hyper_chuzc_non_candidate_measure;
  if (this->max_changed_measure_value * dVar1 < dVar5) {
    uVar4 = -(ulong)(this->max_changed_measure_value < dVar2);
    this->max_hyper_chuzc_non_candidate_measure =
         (double)(~uVar4 & (ulong)this->max_changed_measure_value | (ulong)dVar2 & uVar4);
    this->max_changed_measure_value = dVar5 / pdVar3[iCol];
    this->max_changed_measure_column = iCol;
    return;
  }
  if (dVar2 * dVar1 < dVar5) {
    this->max_hyper_chuzc_non_candidate_measure = dVar5 / dVar1;
  }
  return;
}

Assistant:

void HEkkPrimal::hyperChooseColumnChangedInfeasibility(
    const double infeasibility, const HighsInt iCol) {
  if (infeasibility * infeasibility >
      max_changed_measure_value * edge_weight_[iCol]) {
    max_hyper_chuzc_non_candidate_measure =
        max(max_changed_measure_value, max_hyper_chuzc_non_candidate_measure);
    max_changed_measure_value =
        infeasibility * infeasibility / edge_weight_[iCol];
    max_changed_measure_column = iCol;
  } else if (infeasibility * infeasibility >
             max_hyper_chuzc_non_candidate_measure * edge_weight_[iCol]) {
    max_hyper_chuzc_non_candidate_measure =
        infeasibility * infeasibility / edge_weight_[iCol];
  }
}